

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_avx2.c
# Opt level: O0

void aom_filter_block1d8_h4_avx2
               (uint8_t *src_ptr,ptrdiff_t src_pixels_per_line,uint8_t *output_ptr,
               ptrdiff_t output_pitch,uint32_t output_height,int16_t *filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar10 [32];
  undefined1 auVar12 [16];
  undefined1 auVar11 [64];
  __m128i srcRegFilt3;
  __m128i srcRegFilt2;
  __m128i srcRegFilt1_1;
  __m128i srcReg1;
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m256i filtersReg32;
  __m256i srcReg32b1;
  __m256i srcRegFilt32b3;
  __m256i srcRegFilt32b2;
  __m256i srcRegFilt32b1_1;
  __m256i thirdFilters;
  __m256i secondFilters;
  __m256i filt3Reg;
  __m256i filt2Reg;
  __m256i addFilterReg32;
  __m128i filtersReg;
  __m256i *in_stack_fffffffffffff840;
  ptrdiff_t in_stack_fffffffffffff848;
  uint8_t *in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff860 [16];
  undefined8 local_780;
  uint local_744;
  undefined8 *local_5d8;
  undefined1 (*local_5c8) [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  ulong uStack_58;
  
  auVar9 = filt_global_avx2._64_32_;
  local_5c8 = (undefined1 (*) [16])(in_RDI + -3);
  auVar1 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar1 = vpinsrw_avx(auVar1,0x20,2);
  auVar1 = vpinsrw_avx(auVar1,0x20,3);
  auVar1 = vpinsrw_avx(auVar1,0x20,4);
  auVar1 = vpinsrw_avx(auVar1,0x20,5);
  auVar1 = vpinsrw_avx(auVar1,0x20,6);
  auVar1 = vpinsrw_avx(auVar1,0x20,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar2 = vpinsrw_avx(auVar2,0x20,2);
  auVar2 = vpinsrw_avx(auVar2,0x20,3);
  auVar2 = vpinsrw_avx(auVar2,0x20,4);
  auVar2 = vpinsrw_avx(auVar2,0x20,5);
  auVar2 = vpinsrw_avx(auVar2,0x20,6);
  auVar2 = vpinsrw_avx(auVar2,0x20,7);
  uStack_1f0 = auVar2._0_8_;
  uStack_1e8 = auVar2._8_8_;
  auVar2 = vpsraw_avx(*in_R9,ZEXT416(1));
  vpacksswb_avx(auVar2,auVar2);
  auVar2 = vpinsrw_avx(ZEXT216(0x302),0x302,1);
  auVar2 = vpinsrw_avx(auVar2,0x302,2);
  auVar2 = vpinsrw_avx(auVar2,0x302,3);
  auVar2 = vpinsrw_avx(auVar2,0x302,4);
  auVar2 = vpinsrw_avx(auVar2,0x302,5);
  auVar2 = vpinsrw_avx(auVar2,0x302,6);
  auVar2 = vpinsrw_avx(auVar2,0x302,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x302),0x302,1);
  auVar3 = vpinsrw_avx(auVar3,0x302,2);
  auVar3 = vpinsrw_avx(auVar3,0x302,3);
  auVar3 = vpinsrw_avx(auVar3,0x302,4);
  auVar3 = vpinsrw_avx(auVar3,0x302,5);
  auVar3 = vpinsrw_avx(auVar3,0x302,6);
  auVar3 = vpinsrw_avx(auVar3,0x302,7);
  uStack_1b0 = auVar3._0_8_;
  uStack_1a8 = auVar3._8_8_;
  auVar6._8_8_ = uStack_538;
  auVar6._0_8_ = local_540;
  auVar6._16_8_ = local_540;
  auVar6._24_8_ = uStack_538;
  auVar4._16_8_ = uStack_1b0;
  auVar4._0_16_ = auVar2;
  auVar4._24_8_ = uStack_1a8;
  auVar4 = vpshufb_avx2(auVar6,auVar4);
  auVar2 = vpinsrw_avx(ZEXT216(0x504),0x504,1);
  auVar2 = vpinsrw_avx(auVar2,0x504,2);
  auVar2 = vpinsrw_avx(auVar2,0x504,3);
  auVar2 = vpinsrw_avx(auVar2,0x504,4);
  auVar2 = vpinsrw_avx(auVar2,0x504,5);
  auVar2 = vpinsrw_avx(auVar2,0x504,6);
  auVar2 = vpinsrw_avx(auVar2,0x504,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x504),0x504,1);
  auVar3 = vpinsrw_avx(auVar3,0x504,2);
  auVar3 = vpinsrw_avx(auVar3,0x504,3);
  auVar3 = vpinsrw_avx(auVar3,0x504,4);
  auVar3 = vpinsrw_avx(auVar3,0x504,5);
  auVar3 = vpinsrw_avx(auVar3,0x504,6);
  auVar3 = vpinsrw_avx(auVar3,0x504,7);
  auVar12 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  uStack_170 = auVar12._0_8_;
  uStack_168 = auVar12._8_8_;
  auVar10._8_8_ = uStack_538;
  auVar10._0_8_ = local_540;
  auVar10._16_8_ = local_540;
  auVar10._24_8_ = uStack_538;
  auVar5._16_8_ = uStack_170;
  auVar5._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar5._24_8_ = uStack_168;
  auVar5 = vpshufb_avx2(auVar10,auVar5);
  auVar11 = ZEXT3264(filt_global_avx2._64_32_);
  local_5d8 = in_RDX;
  for (local_744 = in_R8D; auVar10 = auVar11._0_32_, 1 < local_744; local_744 = local_744 - 2) {
    yy_loadu2_128(in_stack_fffffffffffff860._8_8_,in_stack_fffffffffffff860._0_8_);
    auVar7[8] = '\x06';
    auVar7[9] = '\a';
    auVar7[10] = '\a';
    auVar7[0xb] = '\b';
    auVar7[0xc] = '\b';
    auVar7[0xd] = '\t';
    auVar7[0xe] = '\t';
    auVar7[0xf] = '\n';
    auVar7[0] = '\x02';
    auVar7[1] = '\x03';
    auVar7[2] = '\x03';
    auVar7[3] = '\x04';
    auVar7[4] = '\x04';
    auVar7[5] = '\x05';
    auVar7[6] = '\x05';
    auVar7[7] = '\x06';
    auVar7[0x10] = '\x02';
    auVar7[0x11] = '\x03';
    auVar7[0x12] = '\x03';
    auVar7[0x13] = '\x04';
    auVar7[0x14] = '\x04';
    auVar7[0x15] = '\x05';
    auVar7[0x16] = '\x05';
    auVar7[0x17] = '\x06';
    auVar7[0x18] = '\x06';
    auVar7[0x19] = '\a';
    auVar7[0x1a] = '\a';
    auVar7[0x1b] = '\b';
    auVar7[0x1c] = '\b';
    auVar7[0x1d] = '\t';
    auVar7[0x1e] = '\t';
    auVar7[0x1f] = '\n';
    auVar6 = vpshufb_avx2(auVar10,auVar7);
    auVar7 = vpshufb_avx2(auVar10,auVar9);
    auVar10 = vpmaddubsw_avx2(auVar6,auVar4);
    auVar6 = vpmaddubsw_avx2(auVar7,auVar5);
    auVar10 = vpaddsw_avx2(auVar10,auVar6);
    auVar8._16_8_ = uStack_1f0;
    auVar8._0_16_ = auVar1;
    auVar8._24_8_ = uStack_1e8;
    auVar10 = vpaddsw_avx2(auVar10,auVar8);
    auVar10 = vpsraw_avx2(auVar10,ZEXT416(6));
    auVar10 = vpackuswb_avx2(auVar10,auVar10);
    local_5c8 = (undefined1 (*) [16])(*local_5c8 + in_RSI * 2);
    auVar11 = ZEXT1664(auVar10._0_16_);
    xx_storeu2_epi64(in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    local_5d8 = (undefined8 *)(in_RCX * 2 + (long)local_5d8);
  }
  if (local_744 != 0) {
    auVar2[8] = '\x06';
    auVar2[9] = '\a';
    auVar2[10] = '\a';
    auVar2[0xb] = '\b';
    auVar2[0xc] = '\b';
    auVar2[0xd] = '\t';
    auVar2[0xe] = '\t';
    auVar2[0xf] = '\n';
    auVar2[0] = '\x02';
    auVar2[1] = '\x03';
    auVar2[2] = '\x03';
    auVar2[3] = '\x04';
    auVar2[4] = '\x04';
    auVar2[5] = '\x05';
    auVar2[6] = '\x05';
    auVar2[7] = '\x06';
    auVar2 = vpshufb_avx(*local_5c8,auVar2);
    auVar3 = vpshufb_avx(*local_5c8,auVar9._0_16_);
    auVar2 = vpmaddubsw_avx(auVar2,auVar4._0_16_);
    auVar3 = vpmaddubsw_avx(auVar3,auVar5._0_16_);
    auVar2 = vpaddsw_avx(auVar2,auVar3);
    auVar1 = vpaddsw_avx(auVar2,auVar1);
    auVar1 = vpsraw_avx(auVar1,ZEXT416(6));
    uStack_58 = SUB168(ZEXT816(0),4);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uStack_58;
    auVar1 = vpackuswb_avx(auVar1,auVar3 << 0x40);
    local_780 = auVar1._0_8_;
    *local_5d8 = local_780;
  }
  return;
}

Assistant:

static void aom_filter_block1d8_h4_avx2(
    const uint8_t *src_ptr, ptrdiff_t src_pixels_per_line, uint8_t *output_ptr,
    ptrdiff_t output_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m256i addFilterReg32, filt2Reg, filt3Reg;
  __m256i secondFilters, thirdFilters;
  __m256i srcRegFilt32b1_1, srcRegFilt32b2, srcRegFilt32b3;
  __m256i srcReg32b1, filtersReg32;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;
  src_ptr -= 3;
  addFilterReg32 = _mm256_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  // converting the 16 bit (short) to 8 bit (byte) and have the same data
  // in both lanes of 128 bit register.
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);
  // have the same data in both lanes of a 256 bit register
  filtersReg32 = MM256_BROADCASTSI128_SI256(filtersReg);

  // duplicate only the second 16 bits (third and forth byte)
  // across 256 bit register
  secondFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x302u));
  // duplicate only the third 16 bits (fifth and sixth byte)
  // across 256 bit register
  thirdFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x504u));

  filt2Reg = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));
  filt3Reg = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));

  // multiply the size of the source and destination stride by two
  src_stride = src_pixels_per_line << 1;
  dst_stride = output_pitch << 1;
  for (i = output_height; i > 1; i -= 2) {
    // load the 2 strides of source
    srcReg32b1 = yy_loadu2_128(src_ptr + src_pixels_per_line, src_ptr);

    // filter the source buffer
    srcRegFilt32b3 = _mm256_shuffle_epi8(srcReg32b1, filt2Reg);
    srcRegFilt32b2 = _mm256_shuffle_epi8(srcReg32b1, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b3 = _mm256_maddubs_epi16(srcRegFilt32b3, secondFilters);
    srcRegFilt32b2 = _mm256_maddubs_epi16(srcRegFilt32b2, thirdFilters);

    srcRegFilt32b1_1 = _mm256_adds_epi16(srcRegFilt32b3, srcRegFilt32b2);

    // shift by 6 bit each 16 bit
    srcRegFilt32b1_1 = _mm256_adds_epi16(srcRegFilt32b1_1, addFilterReg32);
    srcRegFilt32b1_1 = _mm256_srai_epi16(srcRegFilt32b1_1, 6);

    // shrink to 8 bit each 16 bits
    srcRegFilt32b1_1 = _mm256_packus_epi16(srcRegFilt32b1_1, srcRegFilt32b1_1);

    src_ptr += src_stride;

    xx_storeu2_epi64(output_ptr, output_pitch, &srcRegFilt32b1_1);
    output_ptr += dst_stride;
  }

  // if the number of strides is odd.
  // process only 8 bytes
  if (i > 0) {
    __m128i srcReg1, srcRegFilt1_1;
    __m128i srcRegFilt2, srcRegFilt3;

    srcReg1 = _mm_loadu_si128((const __m128i *)(src_ptr));

    // filter the source buffer
    srcRegFilt2 = _mm_shuffle_epi8(srcReg1, _mm256_castsi256_si128(filt2Reg));
    srcRegFilt3 = _mm_shuffle_epi8(srcReg1, _mm256_castsi256_si128(filt3Reg));

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt2 =
        _mm_maddubs_epi16(srcRegFilt2, _mm256_castsi256_si128(secondFilters));
    srcRegFilt3 =
        _mm_maddubs_epi16(srcRegFilt3, _mm256_castsi256_si128(thirdFilters));

    // add and saturate the results together
    srcRegFilt1_1 = _mm_adds_epi16(srcRegFilt2, srcRegFilt3);

    // shift by 6 bit each 16 bit
    srcRegFilt1_1 =
        _mm_adds_epi16(srcRegFilt1_1, _mm256_castsi256_si128(addFilterReg32));
    srcRegFilt1_1 = _mm_srai_epi16(srcRegFilt1_1, 6);

    // shrink to 8 bit each 16 bits
    srcRegFilt1_1 = _mm_packus_epi16(srcRegFilt1_1, _mm_setzero_si128());

    // save 8 bytes
    _mm_storel_epi64((__m128i *)output_ptr, srcRegFilt1_1);
  }
}